

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher_dirk.c
# Opt level: O0

char * ARKodeButcherTable_DIRKIDToName(ARKODE_DIRKTableID imethod)

{
  undefined4 in_EDI;
  char *local_8;
  
  switch(in_EDI) {
  default:
    arkProcessError((ARKodeMem)0x0,-0x16,0x49,"ARKodeButcherTable_DIRKIDToName",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_butcher_dirk.c"
                    ,"Unknown Butcher table");
    local_8 = (char *)0x0;
    break;
  case 100:
    local_8 = "ARKODE_SDIRK_2_1_2";
    break;
  case 0x65:
    local_8 = "ARKODE_BILLINGTON_3_3_2";
    break;
  case 0x66:
    local_8 = "ARKODE_TRBDF2_3_3_2";
    break;
  case 0x67:
    local_8 = "ARKODE_KVAERNO_4_2_3";
    break;
  case 0x68:
    local_8 = "ARKODE_ARK324L2SA_DIRK_4_2_3";
    break;
  case 0x69:
    local_8 = "ARKODE_CASH_5_2_4";
    break;
  case 0x6a:
    local_8 = "ARKODE_CASH_5_3_4";
    break;
  case 0x6b:
    local_8 = "ARKODE_SDIRK_5_3_4";
    break;
  case 0x6c:
    local_8 = "ARKODE_KVAERNO_5_3_4";
    break;
  case 0x6d:
    local_8 = "ARKODE_ARK436L2SA_DIRK_6_3_4";
    break;
  case 0x6e:
    local_8 = "ARKODE_KVAERNO_7_4_5";
    break;
  case 0x6f:
    local_8 = "ARKODE_ARK548L2SA_DIRK_8_4_5";
    break;
  case 0x70:
    local_8 = "ARKODE_ARK437L2SA_DIRK_7_3_4";
    break;
  case 0x71:
    local_8 = "ARKODE_ARK548L2SAb_DIRK_8_4_5";
    break;
  case 0x72:
    local_8 = "ARKODE_ESDIRK324L2SA_4_2_3";
    break;
  case 0x73:
    local_8 = "ARKODE_ESDIRK325L2SA_5_2_3";
    break;
  case 0x74:
    local_8 = "ARKODE_ESDIRK32I5L2SA_5_2_3";
    break;
  case 0x75:
    local_8 = "ARKODE_ESDIRK436L2SA_6_3_4";
    break;
  case 0x76:
    local_8 = "ARKODE_ESDIRK43I6L2SA_6_3_4";
    break;
  case 0x77:
    local_8 = "ARKODE_QESDIRK436L2SA_6_3_4";
    break;
  case 0x78:
    local_8 = "ARKODE_ESDIRK437L2SA_7_3_4";
    break;
  case 0x79:
    local_8 = "ARKODE_ESDIRK547L2SA_7_4_5";
    break;
  case 0x7a:
    local_8 = "ARKODE_ESDIRK547L2SA2_7_4_5";
    break;
  case 0x7b:
    local_8 = "ARKODE_ARK2_DIRK_3_1_2";
    break;
  case 0x7c:
    local_8 = "ARKODE_BACKWARD_EULER_1_1";
    break;
  case 0x7d:
    local_8 = "ARKODE_IMPLICIT_MIDPOINT_1_2";
    break;
  case 0x7e:
    local_8 = "ARKODE_IMPLICIT_TRAPEZOIDAL_2_2";
    break;
  case 0xffffffff:
    local_8 = "ARKODE_DIRK_NONE";
  }
  return local_8;
}

Assistant:

const char* ARKodeButcherTable_DIRKIDToName(ARKODE_DIRKTableID imethod)
{
  /* Use X-macro to test each method name */
  switch (imethod)
  {
#define ARK_BUTCHER_TABLE(name, coeff) \
  case name: return #name;
#include "arkode_butcher_dirk.def"
#undef ARK_BUTCHER_TABLE

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown Butcher table");
    return NULL;
  }
}